

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

GBufferFilm *
pbrt::GBufferFilm::Create
          (ParameterDictionary *parameters,Float exposureTime,FilterHandle *filter,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  string *filename;
  bool bVar1;
  PixelSensor *sensor;
  GBufferFilm *pGVar2;
  bool writeFP16;
  allocator<char> local_c5;
  Float local_c4;
  Float local_c0;
  Float maxComponentValue;
  RGBColorSpace *colorSpace_local;
  Allocator alloc_local;
  string local_a8;
  FilmBaseParameters filmBaseParameters;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  local_38;
  
  local_c4 = exposureTime;
  colorSpace_local = colorSpace;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filmBaseParameters,"maxcomponentvalue",(allocator<char> *)&local_a8);
  local_c0 = ParameterDictionary::GetOneFloat(parameters,(string *)&filmBaseParameters,INFINITY);
  std::__cxx11::string::~string((string *)&filmBaseParameters);
  maxComponentValue = local_c0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filmBaseParameters,"savefp16",(allocator<char> *)&local_a8);
  bVar1 = ParameterDictionary::GetOneBool(parameters,(string *)&filmBaseParameters,true);
  std::__cxx11::string::~string((string *)&filmBaseParameters);
  writeFP16 = bVar1;
  sensor = PixelSensor::Create(parameters,colorSpace,local_c4,loc,alloc);
  local_38.bits =
       (filter->
       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
       ).bits;
  FilmBaseParameters::FilmBaseParameters
            (&filmBaseParameters,parameters,(FilterHandle *)&local_38,sensor,loc);
  filename = &filmBaseParameters.filename;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"exr",&local_c5);
  bVar1 = HasExtension(filename,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar1) {
    pGVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::GBufferFilm,pbrt::FilmBaseParameters&,pbrt::RGBColorSpace_const*&,float&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
                       (&alloc_local,&filmBaseParameters,&colorSpace_local,&maxComponentValue,
                        &writeFP16,&alloc_local);
    std::__cxx11::string::~string((string *)filename);
    return pGVar2;
  }
  ErrorExit<std::__cxx11::string&>
            (loc,"%s: EXR is the only format supported by the GBufferFilm.",filename);
}

Assistant:

GBufferFilm *GBufferFilm::Create(const ParameterDictionary &parameters,
                                 Float exposureTime, FilterHandle filter,
                                 const RGBColorSpace *colorSpace, const FileLoc *loc,
                                 Allocator alloc) {
    Float maxComponentValue = parameters.GetOneFloat("maxcomponentvalue", Infinity);
    bool writeFP16 = parameters.GetOneBool("savefp16", true);

    PixelSensor *sensor =
        PixelSensor::Create(parameters, colorSpace, exposureTime, loc, alloc);

    FilmBaseParameters filmBaseParameters(parameters, filter, sensor, loc);

    if (!HasExtension(filmBaseParameters.filename, "exr"))
        ErrorExit(loc, "%s: EXR is the only format supported by the GBufferFilm.",
                  filmBaseParameters.filename);

    return alloc.new_object<GBufferFilm>(filmBaseParameters, colorSpace,
                                         maxComponentValue, writeFP16, alloc);
}